

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcParameterizedProfileDef::~IfcParameterizedProfileDef
          (IfcParameterizedProfileDef *this)

{
  IfcProfileDef::~IfcProfileDef(&this->super_IfcProfileDef,&PTR_construction_vtable_24__0082fcf0);
  return;
}

Assistant:

IfcParameterizedProfileDef() : Object("IfcParameterizedProfileDef") {}